

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O2

void __thiscall
serialize_tests::Base::Serialize<ParamsStream<DataStream&,serialize_tests::BaseFormat>>
          (Base *this,ParamsStream<DataStream_&,_serialize_tests::BaseFormat> *s)

{
  long in_FS_OFFSET;
  Span<const_unsigned_char> s_00;
  Span<const_char> local_48;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (s->m_params->m_base_format == RAW) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      ParamsStream<DataStream&,serialize_tests::BaseFormat>::operator<<
                ((ParamsStream<DataStream&,serialize_tests::BaseFormat> *)s,&this->m_base_data);
      return;
    }
  }
  else {
    s_00.m_size = 1;
    s_00.m_data = &this->m_base_data;
    HexStr_abi_cxx11_(&local_38,s_00);
    local_48.m_data = local_38._M_dataplus._M_p;
    local_48.m_size = local_38._M_string_length;
    ParamsStream<DataStream&,serialize_tests::BaseFormat>::operator<<
              ((ParamsStream<DataStream&,serialize_tests::BaseFormat> *)s,&local_48);
    std::__cxx11::string::~string((string *)&local_38);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& s) const
    {
        if (s.template GetParams<BaseFormat>().m_base_format == BaseFormat::RAW) {
            s << m_base_data;
        } else {
            s << Span{HexStr(Span{&m_base_data, 1})};
        }
    }